

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::TestHugeFieldNumbersLite::set_allocated_oneof_test_all_types
          (TestHugeFieldNumbersLite *this,TestAllTypesLite *oneof_test_all_types)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  TestAllTypesLite *oneof_test_all_types_local;
  TestHugeFieldNumbersLite *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArena(&this->super_MessageLite);
  clear_oneof_field(this);
  if (oneof_test_all_types != (TestAllTypesLite *)0x0) {
    submessage_arena_00 =
         google::protobuf::MessageLite::GetArena(&oneof_test_all_types->super_MessageLite);
    message_arena = (Arena *)oneof_test_all_types;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::GetOwnedMessage<proto2_unittest::TestAllTypesLite>
                              (message_arena_00,oneof_test_all_types,submessage_arena_00);
    }
    set_has_oneof_test_all_types(this);
    (this->field_0)._impl_.oneof_field_.oneof_test_all_types_ = (TestAllTypesLite *)message_arena;
  }
  return;
}

Assistant:

void TestHugeFieldNumbersLite::set_allocated_oneof_test_all_types(::proto2_unittest::TestAllTypesLite* PROTOBUF_NULLABLE oneof_test_all_types) {
  ::google::protobuf::Arena* message_arena = GetArena();
  clear_oneof_field();
  if (oneof_test_all_types) {
    ::google::protobuf::Arena* submessage_arena = oneof_test_all_types->GetArena();
    if (message_arena != submessage_arena) {
      oneof_test_all_types = ::google::protobuf::internal::GetOwnedMessage(message_arena, oneof_test_all_types, submessage_arena);
    }
    set_has_oneof_test_all_types();
    _impl_.oneof_field_.oneof_test_all_types_ = oneof_test_all_types;
  }
  // @@protoc_insertion_point(field_set_allocated:proto2_unittest.TestHugeFieldNumbersLite.oneof_test_all_types)
}